

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indirect_string.cpp
# Opt level: O1

void pstore::serialize::serializer<pstore::indirect_string,void>::
     read_string_address<pstore::serialize::archive::database_reader&>
               (database_reader *archive,value_type *value)

{
  typed_address<pstore::address> addr;
  anon_union_8_2_d34ab9e4_for_indirect_string_3 aVar1;
  _func_int **local_28;
  __uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
  local_20;
  
  addr.a_.a_ = (address)archive->db_;
  database::getrou<pstore::address,void>
            ((database *)&stack0xffffffffffffffd8,addr,(archive->addr_).a_);
  aVar1 = *(anon_union_8_2_d34ab9e4_for_indirect_string_3 *)
           local_20._M_t.
           super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
           .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl;
  value->db_ = (database *)addr.a_.a_;
  value->is_pointer_ = false;
  value->field_2 = aVar1;
  (*(code *)local_28)();
  return;
}

Assistant:

void serializer<indirect_string>::read_string_address (DBArchive && archive,
                                                               value_type & value) {
            database const & db = archive.get_db ();
            new (&value)
                value_type (db, *db.getrou (typed_address<address>::make (archive.get_address ())));
        }